

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_23::BinaryReader::BinaryReader
          (BinaryReader *this,void *data,size_t size,BinaryReaderDelegate *delegate,
          ReadBinaryOptions *options)

{
  BinaryReaderDelegate *local_48;
  ReadBinaryOptions *options_local;
  BinaryReaderDelegate *delegate_local;
  size_t size_local;
  void *data_local;
  BinaryReader *this_local;
  
  this->read_end_ = size;
  BinaryReaderDelegate::State::State(&this->state_,(uint8_t *)data,size);
  BinaryReaderLogging::BinaryReaderLogging(&this->logging_delegate_,options->log_stream,delegate);
  local_48 = delegate;
  if (options->log_stream != (Stream *)0x0) {
    local_48 = &(this->logging_delegate_).super_BinaryReaderDelegate;
  }
  this->delegate_ = local_48;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&this->param_types_);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&this->result_types_);
  std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::vector(&this->fields_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->target_depths_);
  this->options_ = options;
  this->last_known_section_ = Invalid;
  this->did_read_names_section_ = false;
  this->reading_custom_section_ = false;
  this->num_func_imports_ = 0;
  this->num_table_imports_ = 0;
  this->num_memory_imports_ = 0;
  this->num_global_imports_ = 0;
  this->num_event_imports_ = 0;
  this->num_function_signatures_ = 0;
  this->num_function_bodies_ = 0;
  this->data_count_ = 0xffffffff;
  (*delegate->_vptr_BinaryReaderDelegate[3])(delegate,&this->state_);
  return;
}

Assistant:

BinaryReader::BinaryReader(const void* data,
                           size_t size,
                           BinaryReaderDelegate* delegate,
                           const ReadBinaryOptions& options)
    : read_end_(size),
      state_(static_cast<const uint8_t*>(data), size),
      logging_delegate_(options.log_stream, delegate),
      delegate_(options.log_stream ? &logging_delegate_ : delegate),
      options_(options),
      last_known_section_(BinarySection::Invalid) {
  delegate->OnSetState(&state_);
}